

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

uint32 BranchBailOutRecord::BailOutFromLoopBody
                 (JavascriptCallStackLayout *layout,BranchBailOutRecord *bailOutRecord,BOOL cond)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  ScriptContext *this;
  JavascriptLibrary *pJVar5;
  ScriptContext *local_40;
  uint32 local_34;
  ScriptContext *scriptContext;
  Var branchValue;
  uint32 bailOutOffset;
  BOOL cond_local;
  BranchBailOutRecord *bailOutRecord_local;
  JavascriptCallStackLayout *layout_local;
  
  if ((bailOutRecord->super_BailOutRecord).parent != (BailOutRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0xb71,"(bailOutRecord->parent == nullptr)",
                       "bailOutRecord->parent == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (cond == 0) {
    local_34 = bailOutRecord->falseBailOutOffset;
  }
  else {
    local_34 = (bailOutRecord->super_BailOutRecord).bailOutOffset;
  }
  scriptContext = (ScriptContext *)0x0;
  if ((bailOutRecord->super_BailOutRecord).branchValueRegSlot != 0xffffffff) {
    this = Js::RecyclableObject::GetScriptContext(*(RecyclableObject **)layout);
    if (cond == 0) {
      pJVar5 = Js::ScriptContext::GetLibrary(this);
      local_40 = (ScriptContext *)
                 Js::JavascriptLibraryBase::GetFalse(&pJVar5->super_JavascriptLibraryBase);
    }
    else {
      pJVar5 = Js::ScriptContext::GetLibrary(this);
      local_40 = (ScriptContext *)
                 Js::JavascriptLibraryBase::GetTrue(&pJVar5->super_JavascriptLibraryBase);
    }
    scriptContext = local_40;
  }
  uVar3 = BailOutRecord::BailOutFromLoopBodyCommon
                    (layout,&bailOutRecord->super_BailOutRecord,local_34,
                     (bailOutRecord->super_BailOutRecord).bailOutKind,scriptContext);
  return uVar3;
}

Assistant:

uint32
BranchBailOutRecord::BailOutFromLoopBody(Js::JavascriptCallStackLayout * layout, BranchBailOutRecord const * bailOutRecord, BOOL cond)
{
    Assert(bailOutRecord->parent == nullptr);
    uint32 bailOutOffset = cond? bailOutRecord->bailOutOffset : bailOutRecord->falseBailOutOffset;
    Js::Var branchValue = nullptr;
    if (bailOutRecord->branchValueRegSlot != Js::Constants::NoRegister)
    {
        Js::ScriptContext *scriptContext = layout->functionObject->GetScriptContext();
        branchValue = (cond ? scriptContext->GetLibrary()->GetTrue() : scriptContext->GetLibrary()->GetFalse());
    }
    return __super::BailOutFromLoopBodyCommon(layout, bailOutRecord, bailOutOffset, bailOutRecord->bailOutKind, branchValue);
}